

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageExtractor.cpp
# Opt level: O0

int Assimp_Extract(char **params,uint num)

{
  aiTexture *tx;
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  aiScene *paVar5;
  undefined8 uVar6;
  FILE *__s;
  size_t sVar7;
  uint local_2b4;
  int m;
  FILE *p;
  allocator<char> local_281;
  string local_280 [39];
  allocator<char> local_259;
  string local_258 [38];
  char local_232 [8];
  char tmp [10];
  string out_ext;
  string out_cpy;
  aiTexture *tex;
  uint i_1;
  aiScene *scene;
  string local_1b0 [32];
  long local_190;
  size_type s;
  long local_168;
  size_type s_1;
  char *local_158;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [32];
  uint local_f0;
  allocator<char> local_e9;
  uint i;
  string extension;
  uint local_c0;
  uint flags;
  uint texIdx;
  bool nosuffix;
  ImportData import;
  string local_80 [8];
  string out;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string in;
  char *invalid;
  uint num_local;
  char **params_local;
  
  in.field_2._8_8_ = anon_var_dwarf_13998;
  if (num == 0) {
    printf("assimp extract: Invalid number of arguments. See \'assimp extract --help\'\n");
    return 1;
  }
  iVar3 = strcmp(*params,"-h");
  if (((iVar3 == 0) || (iVar3 = strcmp(*params,"--help"), iVar3 == 0)) ||
     (iVar3 = strcmp(*params,"-?"), iVar3 == 0)) {
    printf("%s",AICMD_MSG_DUMP_HELP_E);
    return 0;
  }
  pcVar4 = *params;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,pcVar4,&local_49);
  std::allocator<char>::~allocator(&local_49);
  import._46_1_ = 0;
  import._44_1_ = 0;
  if (num < 2) {
    std::allocator<char>::allocator();
    import._44_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (local_80,"-",(allocator<char> *)&import.field_0x2d);
  }
  else {
    pcVar4 = params[1];
    std::allocator<char>::allocator();
    import._46_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (local_80,pcVar4,(allocator<char> *)&import.field_0x2f);
  }
  if ((import._44_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&import.field_0x2d);
  }
  if ((import._46_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&import.field_0x2f);
  }
  ImportData::ImportData((ImportData *)&texIdx);
  ProcessStandardArguments((ImportData *)&texIdx,params + 1,num - 1);
  bVar1 = false;
  local_c0 = 0xffffffff;
  extension.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"bmp",&local_e9);
  std::allocator<char>::~allocator(&local_e9);
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
  local_f0 = 2;
  if (*pcVar4 == '-') {
    local_f0 = 1;
  }
  for (; local_f0 < num; local_f0 = local_f0 + 1) {
    if (params[local_f0] != (char *)0x0) {
      iVar3 = strncmp(params[local_f0],"-f",2);
      if (iVar3 == 0) {
        pcVar4 = params[local_f0];
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_110,pcVar4 + 2,&local_111);
        std::__cxx11::string::operator=((string *)&i,local_110);
        std::__cxx11::string::~string(local_110);
        std::allocator<char>::~allocator(&local_111);
      }
      else {
        iVar3 = strncmp(params[local_f0],"--format=",9);
        if (iVar3 == 0) {
          pcVar4 = params[local_f0];
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_138,pcVar4 + 9,&local_139);
          std::__cxx11::string::operator=((string *)&i,local_138);
          std::__cxx11::string::~string(local_138);
          std::allocator<char>::~allocator(&local_139);
        }
        else {
          iVar3 = strcmp(params[local_f0],"--nosuffix");
          if ((iVar3 == 0) || (iVar3 = strcmp(params[local_f0],"-s"), iVar3 == 0)) {
            bVar1 = true;
          }
          else {
            iVar3 = strncmp(params[local_f0],"--texture=",10);
            if (iVar3 == 0) {
              local_c0 = Assimp::strtoul10(params[local_f0] + 10,(char **)0x0);
            }
            else {
              iVar3 = strncmp(params[local_f0],"-t",2);
              if (iVar3 == 0) {
                local_c0 = Assimp::strtoul10(params[local_f0] + 2,(char **)0x0);
              }
              else {
                iVar3 = strcmp(params[local_f0],"-ba");
                if ((iVar3 == 0) ||
                   (iVar3 = strcmp(params[local_f0],"--bmp-with-alpha"), iVar3 == 0)) {
                  extension.field_2._12_4_ = extension.field_2._12_4_ | 1;
                }
              }
            }
          }
        }
      }
    }
  }
  local_148._M_current = (char *)std::__cxx11::string::begin();
  local_150._M_current = (char *)std::__cxx11::string::end();
  local_158 = (char *)std::__cxx11::string::begin();
  s_1 = (size_type)
        std::
        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                  (local_148,local_150,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_158,tolower);
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
  if (*pcVar4 == '-') {
    local_168 = std::__cxx11::string::find_last_of((char)local_48,0x2e);
    if (local_168 == -1) {
      local_168 = std::__cxx11::string::length();
    }
    std::__cxx11::string::substr((ulong)&s,(ulong)local_48);
    std::__cxx11::string::operator=(local_80,(string *)&s);
    std::__cxx11::string::~string((string *)&s);
  }
  local_190 = std::__cxx11::string::find_last_of((char)local_80,0x2e);
  if (local_190 != -1) {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_1b0,(ulong)local_80);
    std::__cxx11::string::operator=((string *)&i,local_1b0);
    std::__cxx11::string::~string(local_1b0);
    std::__cxx11::string::substr((ulong)&scene,(ulong)local_80);
    std::__cxx11::string::operator=(local_80,(string *)&scene);
    std::__cxx11::string::~string((string *)&scene);
  }
  paVar5 = ImportModel((ImportData *)&texIdx,(string *)local_48);
  if (paVar5 == (aiScene *)0x0) {
    uVar6 = std::__cxx11::string::c_str();
    printf("assimp extract: Unable to load input file %s\n",uVar6);
    params_local._4_4_ = 5;
  }
  else {
    if (local_c0 == 0xffffffff) {
      printf("assimp extract: Exporting %i textures\n",(ulong)paVar5->mNumTextures);
    }
    else if (paVar5->mNumTextures <= local_c0) {
      printf("assimp extract: Texture %i requested, but there are just %i textures\n",
             (ulong)local_c0,(ulong)paVar5->mNumTextures);
      params_local._4_4_ = 6;
      goto LAB_004003b7;
    }
    for (tex._0_4_ = 0; (uint)tex < paVar5->mNumTextures; tex._0_4_ = (uint)tex + 1) {
      if ((local_c0 == 0xffffffff) || (local_c0 == (uint)tex)) {
        tx = paVar5->mTextures[(uint)tex];
        std::__cxx11::string::string((string *)(out_ext.field_2._M_local_buf + 8),local_80);
        std::__cxx11::string::string((string *)(tmp + 2),(string *)&i);
        if ((!bVar1) || (local_c0 == 0xffffffff)) {
          std::__cxx11::string::append(out_ext.field_2._M_local_buf + 8);
          Assimp::ASSIMP_itoa10<10ul>((char (*) [10])local_232,(uint)tex);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_258,local_232,&local_259);
          std::__cxx11::string::append((string *)(out_ext.field_2._M_local_buf + 8));
          std::__cxx11::string::~string(local_258);
          std::allocator<char>::~allocator(&local_259);
        }
        if (tx->mHeight == 0) {
          printf("assimp extract: Texture %i is compressed (%s). Writing native file format.\n",
                 (ulong)(uint)tex,tx->achFormatHint);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_280,tx->achFormatHint,&local_281)
          ;
          std::__cxx11::string::operator=((string *)(tmp + 2),local_280);
          std::__cxx11::string::~string(local_280);
          std::allocator<char>::~allocator(&local_281);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,".",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (tmp + 2));
        std::__cxx11::string::append((string *)(out_ext.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&p);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        __s = fopen(pcVar4,"wb");
        if (__s == (FILE *)0x0) {
          uVar6 = std::__cxx11::string::c_str();
          printf("assimp extract: Unable to open output file %s\n",uVar6);
          params_local._4_4_ = 7;
          bVar2 = true;
        }
        else {
          if (tx->mHeight == 0) {
            sVar7 = fwrite(tx->pcData,(ulong)tx->mWidth,1,__s);
            local_2b4 = (uint)(sVar7 != 1);
          }
          else {
            local_2b4 = DoExport(tx,(FILE *)__s,(string *)&i,extension.field_2._12_4_);
          }
          fclose(__s);
          uVar6 = std::__cxx11::string::c_str();
          printf("assimp extract: Wrote texture %i to %s\n",(ulong)(uint)tex,uVar6);
          if (local_c0 == 0xffffffff) {
            bVar2 = false;
          }
          else {
            params_local._4_4_ = local_2b4;
            bVar2 = true;
          }
        }
        std::__cxx11::string::~string((string *)(tmp + 2));
        std::__cxx11::string::~string((string *)(out_ext.field_2._M_local_buf + 8));
        if (bVar2) goto LAB_004003b7;
      }
    }
    params_local._4_4_ = 0;
  }
LAB_004003b7:
  std::__cxx11::string::~string((string *)&i);
  ImportData::~ImportData((ImportData *)&texIdx);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string((string *)local_48);
  return params_local._4_4_;
}

Assistant:

int Assimp_Extract (const char* const* params, unsigned int num)
{
    const char* const invalid = "assimp extract: Invalid number of arguments. See \'assimp extract --help\'\n";
    // assimp extract in out [options]
    if (num < 1) {
        printf(invalid);
        return 1;
    }

    // --help
    if (!strcmp( params[0], "-h") || !strcmp( params[0], "--help") || !strcmp( params[0], "-?") ) {
        printf("%s",AICMD_MSG_DUMP_HELP_E);
        return 0;
    }



    std::string in  = std::string(params[0]);
    std::string out = (num > 1 ? std::string(params[1]) : "-");

    // get import flags
    ImportData import;
    ProcessStandardArguments(import,params+1,num-1);

    bool nosuffix = false;
    unsigned int texIdx  = 0xffffffff, flags = 0;

    // process other flags
    std::string extension = "bmp";
    for (unsigned int i = (out[0] == '-' ? 1 : 2); i < num;++i)		{
        if (!params[i]) {
            continue;
        }

        if (!strncmp( params[i], "-f",2)) {
            extension = std::string(params[i]+2);
        }
        else if ( !strncmp( params[i], "--format=",9)) {
            extension = std::string(params[i]+9);
        }
        else if ( !strcmp( params[i], "--nosuffix") || !strcmp(params[i],"-s")) {
            nosuffix = true;
        }
        else if ( !strncmp( params[i], "--texture=",10)) {
            texIdx = Assimp::strtoul10(params[i]+10);
        }
        else if ( !strncmp( params[i], "-t",2)) {
            texIdx = Assimp::strtoul10(params[i]+2);
        }
        else if ( !strcmp( params[i], "-ba") ||  !strcmp( params[i], "--bmp-with-alpha")) {
            flags |= AI_EXTRACT_WRITE_BMP_ALPHA;
        }
#if 0
        else {
            printf("Unknown parameter: %s\n",params[i]);
            return 10;
        }
#endif
    }

    std::transform(extension.begin(),extension.end(),extension.begin(),::tolower);
    
    if (out[0] == '-') {
        // take file name from input file
        std::string::size_type s = in.find_last_of('.');
        if (s == std::string::npos)
            s = in.length();

        out = in.substr(0,s);
    }

    // take file extension from file name, if given
    std::string::size_type s = out.find_last_of('.');
    if (s != std::string::npos) {
        extension = out.substr(s+1,in.length()-(s+1));
        out = out.substr(0,s);
    }

    // import the main model
    const aiScene* scene = ImportModel(import,in);
    if (!scene) {
        printf("assimp extract: Unable to load input file %s\n",in.c_str());
        return 5;
    }

    // get the texture(s) to be exported
    if (texIdx != 0xffffffff) {

        // check whether the requested texture is existing
        if (texIdx >= scene->mNumTextures) {
            ::printf("assimp extract: Texture %i requested, but there are just %i textures\n",
                texIdx, scene->mNumTextures);
            return 6;
        }
    }
    else {
        ::printf("assimp extract: Exporting %i textures\n",scene->mNumTextures);
    }

    // now write all output textures
    for (unsigned int i = 0; i < scene->mNumTextures;++i)	{
        if (texIdx != 0xffffffff && texIdx != i) {
            continue;
        }

        const aiTexture* tex = scene->mTextures[i];
        std::string out_cpy = out, out_ext = extension;

        // append suffix if necessary - always if all textures are exported
        if (!nosuffix || (texIdx == 0xffffffff)) {
            out_cpy.append  ("_img");
            char tmp[10];
            Assimp::ASSIMP_itoa10(tmp,i);

            out_cpy.append(std::string(tmp));
        }

        // if the texture is a compressed one, we'll export
        // it to its native file format
        if (!tex->mHeight) {
            printf("assimp extract: Texture %i is compressed (%s). Writing native file format.\n",
                i,tex->achFormatHint);

            // modify file extension
            out_ext = std::string(tex->achFormatHint);
        }
        out_cpy.append("."+out_ext);

        // open output file
        FILE* p = ::fopen(out_cpy.c_str(),"wb");
        if (!p)  {
            printf("assimp extract: Unable to open output file %s\n",out_cpy.c_str());
            return 7;
        }
        int m;

        if (!tex->mHeight) {
            m = (1 != fwrite(tex->pcData,tex->mWidth,1,p));
        }
        else m = DoExport(tex,p,extension,flags);
        ::fclose(p);

        printf("assimp extract: Wrote texture %i to %s\n",i, out_cpy.c_str());
        if (texIdx != 0xffffffff)
            return m;
    }
    return 0;
}